

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverMaxPlus.h
# Opt level: O2

double __thiscall
BGIP_SolverMaxPlus<JointPolicyPureVector>::Solve(BGIP_SolverMaxPlus<JointPolicyPureVector> *this)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t sVar6;
  reference pvVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  shared_ptr<JointPolicyPureVector> temp;
  BayesianGameBase *local_448;
  shared_count asStack_440 [2];
  double local_430;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  var_indices;
  Properties props;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> vars;
  JointPolicyPureVector jpolBG;
  shared_count local_390 [12];
  long local_330;
  MaxPlus mp;
  long local_160;
  FactorGraph fg;
  
  local_448 = *(BayesianGameBase **)
               &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
  asStack_440[0].pi_ =
       *(sp_counted_base **)
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
  lVar3 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                    field_0x10;
  if (lVar3 != 0) {
    LOCK();
    piVar1 = (int *)(lVar3 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  var_indices.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  var_indices.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  uVar9 = (uint)(7 < *(int *)&this->field_0x130);
  vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data
  ._0_16_ = var_indices.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._0_16_;
  MaxPlusSolverForBGs::Construct_AgentTypePair_Variables
            ((shared_ptr *)&local_448,(vector *)&var_indices,(vector *)&vars,uVar9);
  facs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  facs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  facs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  MaxPlusSolverForBGs::Construct_JointType_Factors
            ((shared_ptr *)&local_448,(vector *)&var_indices,(vector *)&vars,(vector *)&facs,uVar9);
  libDAI::FactorGraph::FactorGraph(&fg,(vector *)&facs);
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &props.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       props.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mp,"maxiter",(allocator<char> *)&temp);
  _jpolBG = (element_type *)operator_new(0x10);
  *(undefined ***)_jpolBG = &PTR__placeholder_0012f7b0;
  *(long *)(_jpolBG + 8) = *(long *)&this->super_MaxPlusSolverForBGs;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,(PropertyValue *)&jpolBG);
  if (_jpolBG != (element_type *)0x0) {
    (**(code **)(*(long *)_jpolBG + 8))();
  }
  std::__cxx11::string::~string((string *)&mp);
  iVar2 = *(int *)&this->field_0x130;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mp,"verbose",(allocator<char> *)&temp);
  _jpolBG = (element_type *)operator_new(0x10);
  *(undefined ***)_jpolBG = &PTR__placeholder_0012f7b0;
  *(long *)(_jpolBG + 8) = (long)iVar2;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,(PropertyValue *)&jpolBG);
  if (_jpolBG != (element_type *)0x0) {
    (**(code **)(*(long *)_jpolBG + 8))();
  }
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mp,"updates",(allocator<char> *)&temp);
  boost::any::any<std::__cxx11::string&>
            ((any *)&jpolBG,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_0x110
             ,(type *)0x0,(type *)0x0);
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,(PropertyValue *)&jpolBG);
  if (_jpolBG != (element_type *)0x0) {
    (**(code **)(*(long *)_jpolBG + 8))();
  }
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mp,"damping",(allocator<char> *)&temp);
  _jpolBG = (element_type *)operator_new(0x10);
  *(undefined ***)_jpolBG = &PTR__placeholder_0012f860;
  *(long *)(_jpolBG + 8) = *(long *)&this->field_0x138;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,(PropertyValue *)&jpolBG);
  if (_jpolBG != (element_type *)0x0) {
    (**(code **)(*(long *)_jpolBG + 8))();
  }
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mp,"tol",(allocator<char> *)&temp);
  _jpolBG = (element_type *)operator_new(0x10);
  *(undefined ***)_jpolBG = &PTR__placeholder_0012f860;
  *(long *)(_jpolBG + 8) = 0x3f1a36e2eb1c432d;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,(PropertyValue *)&jpolBG);
  if (_jpolBG != (element_type *)0x0) {
    (**(code **)(*(long *)_jpolBG + 8))();
  }
  std::__cxx11::string::~string((string *)&mp);
  libDAI::MaxPlus::MaxPlus(&mp,&fg,&props,1);
  libDAI::MaxPlus::init();
  if ((this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xc8 == '\x01')
  {
    libDAI::MaxPlus::SetAnyTimeResults
              (false,(ofstream *)0x1,
               *(ofstream **)
                &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xd0
              );
  }
  local_430 = (double)libDAI::MaxPlus::run();
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>::GetNewJpol
            ((BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> *)&jpolBG);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&temp,(shared_ptr<JointPolicyDiscretePure> *)&jpolBG);
  boost::detail::shared_count::~shared_count(local_390);
  JointPolicyPureVector::JointPolicyPureVector(&jpolBG,temp.px);
  uVar9 = 0;
  while( true ) {
    uVar5 = (**(code **)(*(long *)local_448 + 0x18))();
    uVar10 = (ulong)uVar9;
    if (uVar5 <= uVar10) break;
    uVar8 = 0;
    while( true ) {
      sVar6 = BayesianGameBase::GetNrTypes(local_448,uVar9);
      uVar5 = (ulong)uVar8;
      if (sVar6 <= uVar5) break;
      uVar4 = *(undefined8 *)
               (local_160 +
               (ulong)var_indices.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5] * 8);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (*(long *)(local_330 + uVar10 * 8) + 0x38),uVar5);
      *pvVar7 = (value_type)uVar4;
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  BGIPSolution::AddSolution
            ((JointPolicyPureVector *)
             &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x18,
             local_430);
  JointPolicyPureVector::~JointPolicyPureVector(&jpolBG);
  boost::detail::shared_count::~shared_count(&temp.pn);
  libDAI::MaxPlus::~MaxPlus(&mp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
               *)&props);
  libDAI::FactorGraph::~FactorGraph(&fg);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector(&facs);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            (&vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&var_indices);
  boost::detail::shared_count::~shared_count(asStack_440);
  return local_430;
}

Assistant:

double Solve()
        {
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> bgip = 
                BayesianGameIdenticalPayoffSolver_T<JP>::GetBGIPI();

            //an assignment of variables (v3, v8, v14) corresponds to an assignment
            //of joint actions (a1, a2, a3) for a particular joint type.
            //I.e., each (the action taken for eah) (agent,type)-pair is a variable 
            //of the factor graph.
            //let's create these variables
    
            // var_indices[agI][tI] stores the (agent,type)-pair index atI
            std::vector< std::vector<Index> > var_indices;    
            // vars stores the variables. vars[atI]
            std::vector< libDAI::Var > vars;
            bool debug = (_m_verbosity > 7);
            Construct_AgentTypePair_Variables(bgip, var_indices, vars, debug);
            
            //each joint type corresponds to a factor... 
            //let's create them
            std::vector<libDAI::Factor> facs;
            Construct_JointType_Factors(bgip, var_indices, vars, facs, debug);

            //and finally you construct the FactorGraph from that:
            libDAI::FactorGraph fg(facs);

            //size_t  maxiter = 1000;
            //size_t  verb = 2;
            libDAI::Properties props;
            props.Set("maxiter",_m_maxiter);
            //libDAI expects verbosity to be a size_t and will actually crash!
            size_t verb = static_cast<size_t>(_m_verbosity);
            props.Set("verbose", verb);
            props.Set("updates",_m_updateType);
            props.Set("damping",_m_damping);
            double  tol = 1e-4;
            props.Set("tol",tol);
            libDAI::MaxPlus mp (fg, props);
            mp.init();
            if(BayesianGameIdenticalPayoffSolver_T<JP>::GetWriteAnyTimeResults())
                mp.SetAnyTimeResults(true,
                                     BayesianGameIdenticalPayoffSolver_T<JP>::GetResultsOFStream(),
                                     BayesianGameIdenticalPayoffSolver_T<JP>::GetTimingsOFStream());
            double value = mp.run();
            
            //Create the BG policy as computed by MaxPlus...
            
            const std::vector<size_t> & config = mp.GetBestConfiguration();
            // construct the JP with the bgip now
            //JP jpolBG( BayesianGameIdenticalPayoffSolver_T<JP>::_m_solution.GetJointPolicyPureVector() );
            boost::shared_ptr<JP> temp = 
                boost::dynamic_pointer_cast<JP>( BayesianGameIdenticalPayoffSolver_T<JP>::GetNewJpol() );
            JP jpolBG( *temp);
//            delete temp;
            for(Index agI = 0; agI < bgip->GetNrAgents(); agI++)
                for(Index tI = 0; tI < bgip->GetNrTypes(agI); tI++)
                {
                    Index varIndex = var_indices[agI][tI];
                    Index bestAction = config[varIndex];
                    jpolBG.SetAction(agI, tI, bestAction);
                }
            //store the solution
            BayesianGameIdenticalPayoffSolver_T<JP>::AddSolution(jpolBG, value);
            
            return(value);
        }